

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImVec2 ImGui::GetContentRegionMax(void)

{
  ImGuiWindow *pIVar1;
  ImGuiColumnsSet *pIVar2;
  ImGuiWindow *window;
  ImGuiColumnsSet *columns;
  float fVar3;
  ImVec2 IVar4;
  
  pIVar1 = GImGui->CurrentWindow;
  IVar4 = (pIVar1->ContentsRegionRect).Max;
  fVar3 = IVar4.x - (pIVar1->Pos).x;
  IVar4.y = IVar4.y - (pIVar1->Pos).y;
  pIVar2 = (pIVar1->DC).ColumnsSet;
  if (pIVar2 != (ImGuiColumnsSet *)0x0) {
    fVar3 = ((pIVar2->MaxX - pIVar2->MinX) *
             (pIVar2->Columns).Data[(int)((uint)(-2 < pIVar2->Current) + pIVar2->Current)].
             OffsetNorm + pIVar2->MinX) - (pIVar1->WindowPadding).x;
  }
  IVar4.x = fVar3;
  return IVar4;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }